

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O1

void __thiscall CNetBan::Update(CNetBan *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  CBan<CNetRange> *pData;
  CBan<NETADDR> *addr;
  long in_FS_OFFSET;
  char aNetStr [256];
  char aBuf [256];
  char aAddrStr [48];
  char acStack_268 [256];
  char local_168 [256];
  char local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = time_timestamp();
  addr = (this->m_BanAddrPool).m_pFirstUsed;
  if (addr != (CBan<NETADDR> *)0x0) {
    do {
      iVar1 = (addr->m_Info).m_Expires;
      if ((iVar1 == -1) || (iVar2 <= iVar1)) break;
      net_addr_str((NETADDR *)addr,local_68,0x30,0);
      str_format(acStack_268,0x100,"\'%s\'",local_68);
      str_format(local_168,0x100,"ban %s expired",acStack_268);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"net_ban",local_168,0);
      CBanPool<NETADDR,_1>::Remove(&this->m_BanAddrPool,(this->m_BanAddrPool).m_pFirstUsed);
      addr = (this->m_BanAddrPool).m_pFirstUsed;
    } while (addr != (CBan<NETADDR> *)0x0);
  }
  pData = (this->m_BanRangePool).m_pFirstUsed;
  if (pData != (CBan<CNetRange> *)0x0) {
    do {
      iVar1 = (pData->m_Info).m_Expires;
      if ((iVar1 == -1) || (iVar2 <= iVar1)) break;
      pcVar3 = NetToString(this,&pData->m_Data,acStack_268,0x100);
      str_format(local_168,0x100,"ban %s expired",pcVar3);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"net_ban",local_168,0);
      CBanPool<CNetRange,_16>::Remove(&this->m_BanRangePool,(this->m_BanRangePool).m_pFirstUsed);
      pData = (this->m_BanRangePool).m_pFirstUsed;
    } while (pData != (CBan<CNetRange> *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::Update()
{
	int Now = time_timestamp();

	// remove expired bans
	char aBuf[256], aNetStr[256];
	while(m_BanAddrPool.First() && m_BanAddrPool.First()->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER && m_BanAddrPool.First()->m_Info.m_Expires < Now)
	{
		str_format(aBuf, sizeof(aBuf), "ban %s expired", NetToString(&m_BanAddrPool.First()->m_Data, aNetStr, sizeof(aNetStr)));
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		m_BanAddrPool.Remove(m_BanAddrPool.First());
	}
	while(m_BanRangePool.First() && m_BanRangePool.First()->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER && m_BanRangePool.First()->m_Info.m_Expires < Now)
	{
		str_format(aBuf, sizeof(aBuf), "ban %s expired", NetToString(&m_BanRangePool.First()->m_Data, aNetStr, sizeof(aNetStr)));
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		m_BanRangePool.Remove(m_BanRangePool.First());
	}
}